

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::readToken(Reader *this,Token *token)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  byte *pbVar5;
  long lVar6;
  
  pbVar3 = (byte *)this->end_;
  pbVar5 = (byte *)this->current_;
  while (((pbVar5 != pbVar3 && ((ulong)*pbVar5 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0))) {
    pbVar5 = pbVar5 + 1;
    this->current_ = (Location)pbVar5;
  }
  token->start_ = (Location)pbVar5;
  if (pbVar5 == pbVar3) {
LAB_0011bf59:
    token->type_ = tokenEndOfStream;
    goto LAB_0011bfcf;
  }
  pbVar1 = pbVar5 + 1;
  this->current_ = (Location)pbVar1;
  bVar2 = *pbVar5;
  if (0x5a < bVar2) {
    if (bVar2 < 0x6e) {
      if (bVar2 == 0x5b) {
        token->type_ = tokenArrayBegin;
        goto LAB_0011bfcf;
      }
      if (bVar2 == 0x5d) {
        token->type_ = tokenArrayEnd;
        goto LAB_0011bfcf;
      }
      if ((bVar2 == 0x66) && (token->type_ = tokenFalse, 3 < (long)pbVar3 - (long)pbVar1)) {
        lVar6 = 4;
        do {
          if (lVar6 == 0) {
            pbVar5 = pbVar5 + 5;
            goto LAB_0011c006;
          }
          pbVar3 = pbVar5 + lVar6;
          pbVar1 = (byte *)("false" + lVar6);
          lVar6 = lVar6 + -1;
        } while (*pbVar3 == *pbVar1);
      }
    }
    else if (bVar2 < 0x7b) {
      if (bVar2 == 0x6e) {
        token->type_ = tokenNull;
        if (2 < (long)pbVar3 - (long)pbVar1) {
          lVar6 = 3;
          do {
            if (lVar6 == 0) goto LAB_0011bffc;
            pbVar3 = pbVar5 + lVar6;
            pbVar1 = (byte *)("null" + lVar6);
            lVar6 = lVar6 + -1;
          } while (*pbVar3 == *pbVar1);
        }
      }
      else if ((bVar2 == 0x74) && (token->type_ = tokenTrue, 2 < (long)pbVar3 - (long)pbVar1)) {
        lVar6 = 3;
        do {
          if (lVar6 == 0) goto LAB_0011bffc;
          pbVar3 = pbVar5 + lVar6;
          pbVar1 = (byte *)("true" + lVar6);
          lVar6 = lVar6 + -1;
        } while (*pbVar3 == *pbVar1);
      }
    }
    else {
      if (bVar2 == 0x7d) {
        token->type_ = tokenObjectEnd;
        goto LAB_0011bfcf;
      }
      if (bVar2 == 0x7b) {
        token->type_ = tokenObjectBegin;
        goto LAB_0011bfcf;
      }
    }
    goto switchD_0011be6d_caseD_23;
  }
  switch(bVar2) {
  case 0x22:
    token->type_ = tokenString;
    bVar4 = readString(this);
    goto LAB_0011bf7f;
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2e:
    break;
  case 0x2c:
    token->type_ = tokenArraySeparator;
    goto LAB_0011bfcf;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    token->type_ = tokenNumber;
    readNumber(this);
    goto LAB_0011bfcf;
  case 0x2f:
    token->type_ = tokenComment;
    bVar4 = readComment(this);
LAB_0011bf7f:
    if (bVar4 != false) goto LAB_0011bfcf;
    break;
  case 0x3a:
    token->type_ = tokenMemberSeparator;
    goto LAB_0011bfcf;
  default:
    if (bVar2 == 0) goto LAB_0011bf59;
  }
switchD_0011be6d_caseD_23:
  token->type_ = tokenError;
LAB_0011bfcf:
  token->end_ = this->current_;
  return true;
LAB_0011bffc:
  pbVar5 = pbVar5 + 4;
LAB_0011c006:
  this->current_ = (Location)pbVar5;
  goto LAB_0011bfcf;
}

Assistant:

bool Reader::readToken(Token& token) {
  skipSpaces();
  token.start_ = current_;
  Char c = getNextChar();
  bool ok = true;
  switch (c) {
  case '{':
    token.type_ = tokenObjectBegin;
    break;
  case '}':
    token.type_ = tokenObjectEnd;
    break;
  case '[':
    token.type_ = tokenArrayBegin;
    break;
  case ']':
    token.type_ = tokenArrayEnd;
    break;
  case '"':
    token.type_ = tokenString;
    ok = readString();
    break;
  case '/':
    token.type_ = tokenComment;
    ok = readComment();
    break;
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case '-':
    token.type_ = tokenNumber;
    readNumber();
    break;
  case 't':
    token.type_ = tokenTrue;
    ok = match("rue", 3);
    break;
  case 'f':
    token.type_ = tokenFalse;
    ok = match("alse", 4);
    break;
  case 'n':
    token.type_ = tokenNull;
    ok = match("ull", 3);
    break;
  case ',':
    token.type_ = tokenArraySeparator;
    break;
  case ':':
    token.type_ = tokenMemberSeparator;
    break;
  case 0:
    token.type_ = tokenEndOfStream;
    break;
  default:
    ok = false;
    break;
  }
  if (!ok)
    token.type_ = tokenError;
  token.end_ = current_;
  return true;
}